

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O1

void __thiscall
Network::copyCreditTransactions
          (Network *this,int index,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *transactionInfo,CreditCard *toAdd)

{
  pointer pbVar1;
  char *pcVar2;
  CreditCard *this_00;
  int *piVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  char *local_50;
  ulong local_48;
  Network *local_40;
  CreditCard *local_38;
  
  local_40 = this;
  this_00 = (CreditCard *)operator_new(0x80);
  CreditCard::CreditCard(this_00,toAdd);
  uVar8 = (ulong)(index + 1);
  pbVar1 = (transactionInfo->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_38 = this_00;
  if ((ulong)((long)(transactionInfo->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar8)
  goto LAB_0010542e;
  pcVar2 = pbVar1[uVar8]._M_dataplus._M_p;
  local_48 = uVar8;
  piVar3 = __errno_location();
  iVar7 = *piVar3;
  *piVar3 = 0;
  lVar4 = strtol(pcVar2,&local_50,10);
  if (local_50 == pcVar2) goto LAB_00105435;
  if ((int)lVar4 != lVar4) goto LAB_00105441;
  if (*piVar3 == 0x22) goto LAB_00105441;
  if (*piVar3 == 0) {
    *piVar3 = iVar7;
  }
  lVar6 = 0x20;
  if ((int)lVar4 == 1) {
LAB_00105255:
    Peer::addTransaction
              (*(Peer **)((long)&(local_40->peers).size + lVar6),&toAdd->super_Transaction);
LAB_00105268:
    uVar8 = (ulong)(index + 2);
    pbVar1 = (transactionInfo->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(transactionInfo->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar8)
    goto LAB_0010542e;
    pcVar2 = pbVar1[uVar8]._M_dataplus._M_p;
    iVar7 = *piVar3;
    *piVar3 = 0;
    lVar4 = strtol(pcVar2,&local_50,10);
    if (local_50 == pcVar2) goto LAB_0010544d;
    if (lVar4 - 0x80000000U < 0xffffffff00000000) goto LAB_00105459;
    if (*piVar3 == 0x22) goto LAB_00105459;
    if (*piVar3 == 0) {
      *piVar3 = iVar7;
    }
    lVar6 = 0x20;
    if ((int)lVar4 == 1) goto LAB_001053f4;
    pbVar1 = (transactionInfo->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(transactionInfo->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar8)
    goto LAB_0010542e;
    pcVar2 = pbVar1[uVar8]._M_dataplus._M_p;
    iVar7 = *piVar3;
    *piVar3 = 0;
    lVar4 = strtol(pcVar2,&local_50,10);
    if (local_50 == pcVar2) goto LAB_0010548b;
    if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*piVar3 != 0x22)) {
      if (*piVar3 == 0) {
        *piVar3 = iVar7;
      }
      lVar6 = 0x28;
      if ((int)lVar4 == 2) {
LAB_001053f4:
        Peer::addTransaction
                  (*(Peer **)((long)&(local_40->peers).size + lVar6),&local_38->super_Transaction);
        return;
      }
      pbVar1 = (transactionInfo->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(transactionInfo->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar8)
      goto LAB_0010542e;
      pcVar2 = pbVar1[uVar8]._M_dataplus._M_p;
      iVar7 = *piVar3;
      *piVar3 = 0;
      lVar4 = strtol(pcVar2,&local_50,10);
      if (local_50 != pcVar2) {
        if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*piVar3 != 0x22)) {
          if (*piVar3 == 0) {
            *piVar3 = iVar7;
          }
          lVar6 = 0x30;
          if ((int)lVar4 != 3) {
            return;
          }
          goto LAB_001053f4;
        }
        goto LAB_001054d0;
      }
      goto LAB_001054c4;
    }
  }
  else {
    pbVar1 = (transactionInfo->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(transactionInfo->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= local_48)
    goto LAB_0010542e;
    pcVar2 = pbVar1[uVar8]._M_dataplus._M_p;
    iVar7 = *piVar3;
    *piVar3 = 0;
    lVar4 = strtol(pcVar2,&local_50,10);
    if (local_50 == pcVar2) {
      std::__throw_invalid_argument("stoi");
    }
    else if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*piVar3 != 0x22)) {
      if (*piVar3 == 0) {
        *piVar3 = iVar7;
      }
      lVar6 = 0x28;
      if ((int)lVar4 == 2) goto LAB_00105255;
      pbVar1 = (transactionInfo->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(transactionInfo->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= local_48
         ) goto LAB_0010542e;
      pcVar2 = pbVar1[uVar8]._M_dataplus._M_p;
      iVar7 = *piVar3;
      *piVar3 = 0;
      lVar4 = strtol(pcVar2,&local_50,10);
      if (local_50 == pcVar2) {
        std::__throw_invalid_argument("stoi");
      }
      else if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*piVar3 != 0x22)) {
        if (*piVar3 == 0) {
          *piVar3 = iVar7;
        }
        lVar6 = 0x30;
        if ((int)lVar4 == 3) goto LAB_00105255;
        goto LAB_00105268;
      }
      std::__throw_out_of_range("stoi");
LAB_001054c4:
      std::__throw_invalid_argument("stoi");
LAB_001054d0:
      uVar5 = std::__throw_out_of_range("stoi");
      if (*piVar3 == 0) {
        *piVar3 = iVar7;
      }
      _Unwind_Resume(uVar5);
    }
    std::__throw_out_of_range("stoi");
LAB_0010548b:
    std::__throw_invalid_argument("stoi");
  }
  std::__throw_out_of_range("stoi");
LAB_0010542e:
  do {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00105435:
    std::__throw_invalid_argument("stoi");
LAB_00105441:
    std::__throw_out_of_range("stoi");
LAB_0010544d:
    std::__throw_invalid_argument("stoi");
LAB_00105459:
    std::__throw_out_of_range("stoi");
  } while( true );
}

Assistant:

void Network::copyCreditTransactions(int index, vector<string> transactionInfo, CreditCard *toAdd)
{
    CreditCard *copyToAdd;
    copyToAdd = new CreditCard(*toAdd);
//finds which peer to add the transaction to
    if(stoi(transactionInfo.at(index + 1)) == 1)
    {
        peer1->addTransaction(toAdd);
    }
    else if(stoi(transactionInfo.at(index + 1)) == 2)
    {
        peer2->addTransaction(toAdd);
    }
    else if(stoi(transactionInfo.at(index + 1)) == 3)
    {
        peer3->addTransaction(toAdd);
    }
    //finds which peer to add the copy of the transaction to
    if(stoi(transactionInfo.at(index + 2)) == 1)
    {
        peer1->addTransaction(copyToAdd);
    }
    else if(stoi(transactionInfo.at(index + 2)) == 2)
    {
        peer2->addTransaction(copyToAdd);
    }
    else if(stoi(transactionInfo.at(index + 2)) == 3)
    {
        peer3->addTransaction(copyToAdd);
    }
}